

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

void Abc_ManTimeDup(Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew)

{
  void **ppvVar1;
  void **ppvVar2;
  Abc_ManTime_t *pAVar3;
  Abc_ManTime_t *pAVar4;
  Abc_Time_t *pAVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  size_t __size;
  
  if (pNtkOld->pManTime != (Abc_ManTime_t *)0x0) {
    if (pNtkOld->vCis->nSize != pNtkNew->vCis->nSize) {
      __assert_fail("Abc_NtkCiNum(pNtkOld) == Abc_NtkCiNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x21e,"void Abc_ManTimeDup(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (pNtkOld->vCos->nSize != pNtkNew->vCos->nSize) {
      __assert_fail("Abc_NtkCoNum(pNtkOld) == Abc_NtkCoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x21f,"void Abc_ManTimeDup(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (pNtkOld->nObjCounts[8] != pNtkNew->nObjCounts[8]) {
      __assert_fail("Abc_NtkLatchNum(pNtkOld) == Abc_NtkLatchNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x220,"void Abc_ManTimeDup(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    pAVar3 = Abc_ManTimeStart(pNtkNew);
    pNtkNew->pManTime = pAVar3;
    Abc_ManTimeExpand(pAVar3,pNtkNew->vObjs->nSize,0);
    pNtkNew->pManTime->tArrDef = pNtkOld->pManTime->tArrDef;
    pNtkNew->pManTime->tReqDef = pNtkOld->pManTime->tReqDef;
    pVVar7 = pNtkOld->vCis;
    pAVar4 = pNtkOld->pManTime;
    pAVar3 = pNtkNew->pManTime;
    if (0 < pVVar7->nSize) {
      ppvVar1 = pAVar4->vArrs->pArray;
      ppvVar2 = pAVar3->vArrs->pArray;
      lVar6 = 0;
      do {
        if (pNtkNew->vCis->nSize <= lVar6) goto LAB_002b45c3;
        *(undefined8 *)ppvVar2[*(int *)((long)pNtkNew->vCis->pArray[lVar6] + 0x10)] =
             *ppvVar1[*(int *)((long)pVVar7->pArray[lVar6] + 0x10)];
        lVar6 = lVar6 + 1;
        pVVar7 = pNtkOld->vCis;
      } while (lVar6 < pVVar7->nSize);
      pAVar4 = pNtkOld->pManTime;
      pAVar3 = pNtkNew->pManTime;
    }
    pVVar7 = pNtkOld->vCos;
    if (0 < pVVar7->nSize) {
      ppvVar1 = pAVar4->vReqs->pArray;
      ppvVar2 = pAVar3->vReqs->pArray;
      lVar6 = 0;
      do {
        if (pNtkNew->vCos->nSize <= lVar6) {
LAB_002b45c3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        *(undefined8 *)ppvVar2[*(int *)((long)pNtkNew->vCos->pArray[lVar6] + 0x10)] =
             *ppvVar1[*(int *)((long)pVVar7->pArray[lVar6] + 0x10)];
        lVar6 = lVar6 + 1;
        pVVar7 = pNtkOld->vCos;
      } while (lVar6 < pVVar7->nSize);
      pAVar3 = pNtkNew->pManTime;
      pAVar4 = pNtkOld->pManTime;
    }
    pAVar3->tInDriveDef = pAVar4->tInDriveDef;
    pNtkNew->pManTime->tOutLoadDef = pNtkOld->pManTime->tOutLoadDef;
    pAVar3 = pNtkOld->pManTime;
    if (pAVar3->tInDrive != (Abc_Time_t *)0x0) {
      __size = (long)pNtkOld->vCis->nSize << 3;
      pAVar5 = (Abc_Time_t *)malloc(__size);
      pNtkNew->pManTime->tInDrive = pAVar5;
      memcpy(pAVar5,pAVar3->tInDrive,__size);
    }
    if (pAVar3->tOutLoad != (Abc_Time_t *)0x0) {
      pAVar5 = (Abc_Time_t *)malloc((long)pNtkOld->vCis->nSize << 3);
      pNtkNew->pManTime->tOutLoad = pAVar5;
      memcpy(pAVar5,pAVar3->tOutLoad,(long)pNtkOld->vCos->nSize << 3);
      return;
    }
  }
  return;
}

Assistant:

void Abc_ManTimeDup( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew )
{
    extern void Abc_NtkTimePrint( Abc_Ntk_t * pNtk );

    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimesOld, ** ppTimesNew;
    int i;
    if ( pNtkOld->pManTime == NULL )
        return;
    assert( Abc_NtkCiNum(pNtkOld) == Abc_NtkCiNum(pNtkNew) );
    assert( Abc_NtkCoNum(pNtkOld) == Abc_NtkCoNum(pNtkNew) );
    assert( Abc_NtkLatchNum(pNtkOld) == Abc_NtkLatchNum(pNtkNew) );
    // create the new timing manager
    pNtkNew->pManTime = Abc_ManTimeStart(pNtkNew);
    Abc_ManTimeExpand( pNtkNew->pManTime, Abc_NtkObjNumMax(pNtkNew), 0 );
    // set the default timing
    pNtkNew->pManTime->tArrDef = pNtkOld->pManTime->tArrDef;
    pNtkNew->pManTime->tReqDef = pNtkOld->pManTime->tReqDef;
    // set the CI timing
    ppTimesOld = (Abc_Time_t **)pNtkOld->pManTime->vArrs->pArray;
    ppTimesNew = (Abc_Time_t **)pNtkNew->pManTime->vArrs->pArray;
    Abc_NtkForEachCi( pNtkOld, pObj, i )
        *ppTimesNew[ Abc_NtkCi(pNtkNew,i)->Id ] = *ppTimesOld[ pObj->Id ];
    // set the CO timing
    ppTimesOld = (Abc_Time_t **)pNtkOld->pManTime->vReqs->pArray;
    ppTimesNew = (Abc_Time_t **)pNtkNew->pManTime->vReqs->pArray;
    Abc_NtkForEachCo( pNtkOld, pObj, i )
        *ppTimesNew[ Abc_NtkCo(pNtkNew,i)->Id ] = *ppTimesOld[ pObj->Id ];
    // duplicate input drive
    pNtkNew->pManTime->tInDriveDef = pNtkOld->pManTime->tInDriveDef; 
    pNtkNew->pManTime->tOutLoadDef = pNtkOld->pManTime->tOutLoadDef; 
    if ( pNtkOld->pManTime->tInDrive )
    {
        pNtkNew->pManTime->tInDrive = ABC_ALLOC( Abc_Time_t, Abc_NtkCiNum(pNtkOld) );
        memcpy( pNtkNew->pManTime->tInDrive, pNtkOld->pManTime->tInDrive, sizeof(Abc_Time_t) * Abc_NtkCiNum(pNtkOld) );
    }
    if ( pNtkOld->pManTime->tOutLoad )
    {
        pNtkNew->pManTime->tOutLoad = ABC_ALLOC( Abc_Time_t, Abc_NtkCiNum(pNtkOld) );
        memcpy( pNtkNew->pManTime->tOutLoad, pNtkOld->pManTime->tOutLoad, sizeof(Abc_Time_t) * Abc_NtkCoNum(pNtkOld) );
    }
}